

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

LengthDisplay
ON_DimStyle::LengthDisplayFromUnitsAndFormat
          (LengthUnitSystem dimunits,OBSOLETE_length_format lengthformat)

{
  LengthDisplay local_10;
  LengthDisplay display;
  OBSOLETE_length_format lengthformat_local;
  LengthUnitSystem dimunits_local;
  
  local_10 = ModelUnits;
  if ((lengthformat == FeetInches) || (lengthformat == FeetDecimalInches)) {
    local_10 = FeetAndInches;
  }
  else {
    switch(dimunits) {
    case Millimeters:
      local_10 = Millmeters;
      break;
    case Centimeters:
      local_10 = Centimeters;
      break;
    case Meters:
      local_10 = Meters;
      break;
    case Kilometers:
      local_10 = Kilometers;
      break;
    default:
      break;
    case Inches:
      if (lengthformat == Fractional) {
        local_10 = InchesFractional;
      }
      else {
        local_10 = InchesDecimal;
      }
      break;
    case Feet:
      local_10 = FeetDecimal;
      break;
    case Miles:
      local_10 = Miles;
    }
  }
  return local_10;
}

Assistant:

ON_DimStyle::LengthDisplay ON_DimStyle::LengthDisplayFromUnitsAndFormat(
  ON::LengthUnitSystem dimunits, 
  ON_DimStyle::OBSOLETE_length_format lengthformat)
{
  ON_DimStyle::LengthDisplay display = ON_DimStyle::LengthDisplay::ModelUnits;

  if (
    ON_DimStyle::OBSOLETE_length_format::FeetInches == lengthformat
    || ON_DimStyle::OBSOLETE_length_format::FeetDecimalInches == lengthformat
    )
  {
    display = ON_DimStyle::LengthDisplay::FeetAndInches;
  }
  else
  {
    switch (dimunits)
    {
    case ON::LengthUnitSystem::Millimeters:
      display = ON_DimStyle::LengthDisplay::Millmeters;
      break;
    case ON::LengthUnitSystem::Centimeters:
      display = ON_DimStyle::LengthDisplay::Centimeters;
      break;
    case ON::LengthUnitSystem::Meters:
      display = ON_DimStyle::LengthDisplay::Meters;
      break;
    case ON::LengthUnitSystem::Kilometers:
      display = ON_DimStyle::LengthDisplay::Kilometers;
      break;
    case ON::LengthUnitSystem::Miles:
      display = ON_DimStyle::LengthDisplay::Miles;
      break;
    case ON::LengthUnitSystem::Inches:
      if (ON_DimStyle::OBSOLETE_length_format::Fractional == lengthformat)
        display = ON_DimStyle::LengthDisplay::InchesFractional;
      else
        display = ON_DimStyle::LengthDisplay::InchesDecimal;
      break;
    case ON::LengthUnitSystem::Feet:
      display = ON_DimStyle::LengthDisplay::FeetDecimal;
      break;
    default:
      break;
    }
  }
  return display;
}